

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O2

int CVmObjList::getp_cdr(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  vm_datatype_t vVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  int iVar5;
  vm_obj_id_t vVar6;
  size_t element_count;
  
  if (getp_cdr(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    iVar5 = __cxa_guard_acquire(&getp_cdr(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc
                               );
    if (iVar5 != 0) {
      getp_cdr::desc.min_argc_ = 0;
      getp_cdr::desc.opt_argc_ = 0;
      getp_cdr::desc.varargs_ = 0;
      __cxa_guard_release(&getp_cdr(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
    }
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,argc,&getp_cdr::desc);
  pvVar4 = sp_;
  if (iVar5 == 0) {
    uVar3 = *(undefined4 *)&self_val->field_0x4;
    aVar1 = self_val->val;
    sp_ = sp_ + 1;
    pvVar4->typ = self_val->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar1;
    if ((ulong)*(ushort *)lst == 0) {
      vVar2 = VM_NIL;
    }
    else {
      element_count = (ulong)*(ushort *)lst - 1;
      vVar6 = create(0,element_count);
      memcpy((void *)(*(long *)((long)&G_obj_table_X.pages_[vVar6 >> 0xc][vVar6 & 0xfff].ptr_ + 8) +
                     2),lst + 7,element_count * 5);
      (retval->val).obj = vVar6;
      vVar2 = VM_OBJ;
    }
    retval->typ = vVar2;
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjList::getp_cdr(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                         const char *lst, uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* push a self-reference for GC protection */
    G_stk->push(self_val);

    /* 
     *   if the list has no elements, return nil; otherwise, return the
     *   sublist starting with the second element (thus return an empty
     *   list if the original list has only one element) 
     */
    if (vmb_get_len(lst) == 0)
    {
        /* no elements - return nil */
        retval->set_nil();
    }
    else
    {
        vm_obj_id_t obj;
        size_t new_cnt;

        /* reduce the list count by one */
        new_cnt = vmb_get_len(lst) - 1;

        /* skip past the first element */
        lst += VMB_LEN + VMB_DATAHOLDER;

        /* create the new list */
        obj = create(vmg_ FALSE, new_cnt);

        /* copy the elements */
        ((CVmObjList *)vm_objp(vmg_ obj))->cons_copy_data(0, lst, new_cnt);

        /* return the new object */
        retval->set_obj(obj);
    }

    /* discard the stack protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}